

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O3

void __thiscall
fm_ns_local_search::move_node
          (fm_ns_local_search *this,AdjList *G,NodeID *node,PartitionID *to_block,
          PartitionID *other_block,vector<int,_std::allocator<int>_> *block_weights,
          vector<bool,_std::allocator<bool>_> *moved_out_of_S,
          vector<maxNodeHeap,_std::allocator<maxNodeHeap>_> *queues,
          vector<change_set,_std::allocator<change_set>_> *rollback_info,PartialBoundary *separator)

{
  pointer *ppcVar1;
  ulong *puVar2;
  iterator iVar3;
  pointer piVar4;
  iterator iVar5;
  pointer pvVar6;
  uint *puVar7;
  uint *puVar8;
  int *piVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  pointer pmVar11;
  change_set cVar12;
  change_set cVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  mapped_type *pmVar17;
  ulong uVar18;
  int *piVar19;
  uint uVar20;
  uint *puVar21;
  change_set *pcVar22;
  uint *puVar23;
  int v;
  int neighbor;
  vector<int,_std::allocator<int>_> to_be_added;
  change_set cur_move;
  change_set local_a8;
  change_set local_a0;
  uint *local_98;
  iterator iStack_90;
  int *local_88;
  AdjList *local_80;
  uint *local_78;
  iterator iStack_70;
  int *local_68;
  uint *local_60;
  change_set local_58;
  vector<int,_std::allocator<int>_> *local_50;
  int *local_48;
  ulong local_40;
  PartialBoundary *local_38;
  
  local_58.node = *node;
  local_58.block =
       (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[local_58.node];
  iVar3._M_current =
       (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_80 = G;
  local_50 = block_weights;
  if (iVar3._M_current ==
      (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
              ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar3,&local_58);
  }
  else {
    cVar13.block = local_58.block;
    cVar13.node = local_58.node;
    *iVar3._M_current = cVar13;
    ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  local_78 = (uint *)CONCAT44(local_78._4_4_,*node);
  local_38 = separator + 8;
  std::
  _Hashtable<const_int,_std::pair<const_int,_is_boundary>,_std::allocator<std::pair<const_int,_is_boundary>_>,_std::__detail::_Select1st,_compare_nodes_contains,_hash_boundary_nodes,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase();
  iVar15 = *to_block;
  (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[*node] = iVar15;
  piVar4 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar19 = piVar4 + iVar15;
  *piVar19 = *piVar19 + 1;
  piVar19 = piVar4 + 2;
  *piVar19 = *piVar19 + -1;
  iVar15 = *node;
  iVar14 = iVar15 + 0x3f;
  if (-1 < (long)iVar15) {
    iVar14 = iVar15;
  }
  puVar2 = (moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           (long)(iVar14 >> 6) +
           (ulong)(((long)iVar15 & 0x800000000000003fU) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)iVar15 & 0x3f);
  iVar5._M_current =
       (this->moved_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->moved_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->moved_nodes,iVar5,node);
  }
  else {
    *iVar5._M_current = iVar15;
    (this->moved_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_78 = (uint *)0x0;
  iStack_70._M_current = (int *)0x0;
  local_68 = (int *)0x0;
  local_88 = (int *)0x0;
  local_98 = (uint *)0x0;
  iStack_90._M_current = (int *)0x0;
  pvVar6 = (local_80->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar23 = *(uint **)&pvVar6[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data;
  puVar7 = (uint *)pvVar6[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar23 != puVar7) {
    local_40 = 0x800000000000003f;
    local_60 = (uint *)node;
    local_48 = other_block;
    do {
      local_a8.block = *puVar23;
      lVar16 = (long)local_a8.block;
      if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar16] < 0) {
        piVar4 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar4[(int)*local_60] == *other_block) {
          local_a0.block = piVar4[lVar16];
          iVar3._M_current =
               (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_a0.node = local_a8.block;
          if (iVar3._M_current ==
              (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
                      ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar3,
                       &local_a0);
            lVar16 = (long)local_a8.block;
          }
          else {
            cVar12.block = local_a0.block;
            cVar12.node = local_a8.block;
            *iVar3._M_current = cVar12;
            ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar16] = 2;
          local_a8.node = local_a8.block;
          pmVar17 = std::__detail::
                    _Map_base<const_int,_std::pair<const_int,_is_boundary>,_std::allocator<std::pair<const_int,_is_boundary>_>,_std::__detail::_Select1st,_compare_nodes_contains,_hash_boundary_nodes,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<const_int,_std::pair<const_int,_is_boundary>,_std::allocator<std::pair<const_int,_is_boundary>_>,_std::__detail::_Select1st,_compare_nodes_contains,_hash_boundary_nodes,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_38,&local_a8.node);
          pmVar17->contains = true;
          piVar4 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar19 = piVar4 + *other_block;
          *piVar19 = *piVar19 + -1;
          piVar19 = piVar4 + 2;
          *piVar19 = *piVar19 + 1;
          uVar18 = (ulong)local_a8.block;
          uVar20 = local_a8.block + 0x3f;
          if (-1 < (long)uVar18) {
            uVar20 = local_a8.block;
          }
          if (((moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)((int)uVar20 >> 6) +
                (ulong)((uVar18 & local_40) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar18 & 0x3f) & 1) == 0) {
            if (iStack_70._M_current == local_68) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_a8.block);
            }
            else {
              *iStack_70._M_current = local_a8.block;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
          }
          pvVar6 = (local_80->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar8 = (uint *)pvVar6[local_a8.block].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
          for (puVar21 = *(uint **)&pvVar6[local_a8.block].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data; other_block = local_48,
              puVar21 != puVar8; puVar21 = puVar21 + 1) {
            local_a8.node = *puVar21;
            if (((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_a8.node] < 0) &&
               (iVar15 = (*(((queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_priority_queue_interface)._vptr_priority_queue_interface[0xd])(),
               (char)iVar15 != '\0')) {
              if (iStack_90._M_current == local_88) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&local_a8.node);
              }
              else {
                *iStack_90._M_current = local_a8.node;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
            }
          }
        }
        else if (piVar4[lVar16] == 2) {
          if (iStack_90._M_current == local_88) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&local_a8.block);
          }
          else {
            *iStack_90._M_current = local_a8.block;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
      }
      iVar5._M_current = iStack_70._M_current;
      puVar23 = puVar23 + 1;
      puVar21 = local_78;
    } while (puVar23 != puVar7);
    for (; puVar21 != (uint *)iVar5._M_current; puVar21 = puVar21 + 1) {
      uVar20 = *puVar21;
      uVar18 = 1;
      local_a0.node = 1;
      local_a8.node = 1;
      pvVar6 = (local_80->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar19 = pvVar6[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar9 = pvVar6[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar19 != piVar9) {
        pvVar10 = this->partition_index;
        piVar4 = (this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (piVar4[*piVar19] < 0) {
            iVar15 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[*piVar19];
            pcVar22 = &local_a8;
            if (iVar15 != 0) {
              if (iVar15 != 1) goto LAB_001220c4;
              pcVar22 = &local_a0;
            }
            pcVar22->node = pcVar22->node + -1;
          }
LAB_001220c4:
          piVar19 = piVar19 + 1;
        } while (piVar19 != piVar9);
        uVar18 = (ulong)(uint)local_a0.node;
      }
      pmVar11 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
                super__Vector_impl_data._M_start;
      (*(pmVar11->super_priority_queue_interface)._vptr_priority_queue_interface[4])
                (pmVar11,(ulong)uVar20,uVar18);
      pmVar11 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
                super__Vector_impl_data._M_start;
      (*pmVar11[1].super_priority_queue_interface._vptr_priority_queue_interface[4])
                (pmVar11 + 1,(ulong)uVar20,(ulong)(uint)local_a8.node);
    }
  }
  local_60 = (uint *)iStack_90._M_current;
  if (local_98 != (uint *)iStack_90._M_current) {
    puVar23 = local_98;
    do {
      uVar20 = *puVar23;
      uVar18 = 1;
      local_a0.node = 1;
      local_a8.node = 1;
      pvVar6 = (local_80->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar19 = pvVar6[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar9 = pvVar6[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar19 != piVar9) {
        pvVar10 = this->partition_index;
        piVar4 = (this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if ((piVar4[*piVar19] < 0) &&
             ((iVar15 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[*piVar19], pcVar22 = &local_a8, iVar15 == 0
              || (pcVar22 = &local_a0, iVar15 == 1)))) {
            pcVar22->node = pcVar22->node + -1;
          }
          piVar19 = piVar19 + 1;
        } while (piVar19 != piVar9);
        uVar18 = (ulong)(uint)local_a0.node;
      }
      pmVar11 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
                super__Vector_impl_data._M_start;
      (*(pmVar11->super_priority_queue_interface)._vptr_priority_queue_interface[10])
                (pmVar11,(ulong)uVar20,uVar18);
      pmVar11 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
                super__Vector_impl_data._M_start;
      (*pmVar11[1].super_priority_queue_interface._vptr_priority_queue_interface[10])
                (pmVar11 + 1,(ulong)uVar20,(ulong)(uint)local_a8.node);
      puVar23 = puVar23 + 1;
    } while (puVar23 != local_60);
  }
  if (local_98 != (uint *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_78 != (uint *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

inline
void fm_ns_local_search::move_node( AdjList & G, NodeID & node, PartitionID & to_block, PartitionID & other_block, 
                                    std::vector< NodeWeight > & block_weights,
                                    std::vector< bool > & moved_out_of_S, 
                                    std::vector< maxNodeHeap > & queues,
                                    std::vector< change_set > & rollback_info,
                                    PartialBoundary & separator) {

        change_set cur_move;
        cur_move.node = node;
        cur_move.block = partition_index[node];
        rollback_info.push_back(cur_move);
        separator.deleteNode(node);

        partition_index[node] = to_block;
        block_weights[to_block] += 1;
        block_weights[2] -= 1;
        moved_out_of_S[node] = true;
        moved_nodes.push_back(node);

        std::vector<NodeID> to_be_added;
        std::vector<NodeID> to_be_updated; // replace by hashmap?
        Gain gain_achieved = 1;

        for (int neighbor : G[node]) 
        {
                if (x[neighbor] < 0) {
                        if(partition_index[node] == other_block) {
                                change_set cur_move;
                                cur_move.node = neighbor;
                                cur_move.block = partition_index[neighbor];
                                rollback_info.push_back(cur_move);

                                partition_index[neighbor] = 2;
                                separator.insert(neighbor);

                                block_weights[other_block] -= 1;
                                block_weights[2]           += 1;
                                gain_achieved              -= 1;

                                if(!moved_out_of_S[neighbor]) {
                                        to_be_added.push_back(neighbor);
                                }

                                for (int v : G[neighbor]) {
                                        if(x[v] < 0) {
                                                if(queues[0].contains(v)) {
                                                        to_be_updated.push_back(v);
                                                }   
                                        }
                                }

                        } else if(partition_index[neighbor] == 2) {
                                to_be_updated.push_back(neighbor);
                        }
                }
        }        

        Gain toLHS = 0;
        Gain toRHS = 0;

        for(NodeID node : to_be_added) {
                compute_gain( G, node, toLHS, toRHS);
                queues[0].insert(node, toLHS);
                queues[1].insert(node, toRHS);
        }

        for(NodeID node : to_be_updated) {
                compute_gain( G, node, toLHS, toRHS);
                queues[0].changeKey(node, toLHS);
                queues[1].changeKey(node, toRHS);
        }
}